

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

UCalendarDateFields booster::locale::impl_icu::to_icu(period_mark f)

{
  invalid_argument *this;
  string local_40;
  
  if (f - era < 0x10) {
    return *(UCalendarDateFields *)(&DAT_001ad4c0 + (ulong)(f - era) * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Invalid date_time period type","");
  invalid_argument::invalid_argument(this,&local_40);
  __cxa_throw(this,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
}

Assistant:

static UCalendarDateFields to_icu(period::marks::period_mark f)
    {
        using namespace period::marks;

        switch(f) {
        case era: return UCAL_ERA;
        case year: return UCAL_YEAR;
        case extended_year: return UCAL_EXTENDED_YEAR;
        case month: return UCAL_MONTH;
        case day: return UCAL_DATE;
        case day_of_year: return UCAL_DAY_OF_YEAR;
        case day_of_week: return UCAL_DAY_OF_WEEK;
        case day_of_week_in_month:  return UCAL_DAY_OF_WEEK_IN_MONTH;
        case day_of_week_local: return UCAL_DOW_LOCAL;
        case hour: return UCAL_HOUR_OF_DAY;
        case hour_12: return UCAL_HOUR;
        case am_pm: return UCAL_AM_PM;
        case minute: return UCAL_MINUTE;
        case second: return UCAL_SECOND;
        case week_of_year: return UCAL_WEEK_OF_YEAR;
        case week_of_month: return UCAL_WEEK_OF_MONTH;
        default:
            throw booster::invalid_argument("Invalid date_time period type");
        }
    }